

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < (long)value->current_size_) {
    lVar3 = 0;
    sVar2 = 0;
    do {
      lVar1 = *(long *)((long)value->arena_or_elements_ + lVar3 * 8);
      uVar4 = lVar1 >> 0x3f ^ lVar1 * 2 | 1;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6);
      lVar3 = lVar3 + 1;
    } while (value->current_size_ != lVar3);
    return sVar2;
  }
  return 0;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}